

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string_t * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::get_string(string_t *__return_storage_ptr__,lexer *this)

{
  uchar uVar1;
  uchar *puVar2;
  ulong codepoint1;
  ulong codepoint2;
  invalid_argument *this_00;
  uchar *puVar3;
  lexer_char_t *k;
  uchar *puVar4;
  string_t local_50;
  
  if ((long)this->m_cursor - (long)this->m_start < 2) {
    __assert_fail("m_cursor - m_start >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antonio-ramadas[P]nurse-rostering-solution/code/json.hpp"
                  ,0x2ae1,
                  "string_t nlohmann::basic_json<>::lexer::get_string() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  puVar4 = this->m_start;
switchD_0010da22_caseD_6f:
  while( true ) {
    puVar3 = puVar4;
    puVar4 = puVar3 + 1;
    if (this->m_cursor + -1 <= puVar4) {
      return __return_storage_ptr__;
    }
    local_50._M_dataplus._M_p._0_1_ = 0x5c;
    puVar2 = std::__find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (puVar4,this->m_cursor + -1,&local_50);
    if (puVar2 == puVar4) break;
    for (; puVar4 < puVar2; puVar4 = puVar4 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    puVar4 = puVar2 + -1;
  }
  puVar4 = puVar3 + 2;
  uVar1 = puVar3[2];
  switch(uVar1) {
  case 'n':
    break;
  case 'o':
  case 'p':
  case 'q':
  case 's':
    goto switchD_0010da22_caseD_6f;
  case 'r':
    break;
  case 't':
    break;
  case 'u':
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,puVar3 + 3,puVar3 + 7);
    codepoint1 = strtoul(local_50._M_dataplus._M_p,(char **)0x0,0x10);
    std::__cxx11::string::~string((string *)&local_50);
    if ((codepoint1 & 0xfffffffffffffc00) == 0xd800) {
      if (((puVar3 + 8 < this->m_limit) && (puVar3[7] == '\\')) && (puVar3[8] == 'u')) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,puVar3 + 9,puVar3 + 0xd)
        ;
        codepoint2 = strtoul(local_50._M_dataplus._M_p,(char **)0x0,0x10);
        std::__cxx11::string::~string((string *)&local_50);
        to_unicode(&local_50,codepoint1,codepoint2);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
        puVar4 = puVar3 + 0xc;
        goto switchD_0010da22_caseD_6f;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"missing low surrogate");
    }
    else {
      if ((codepoint1 & 0xfffffffffffffc00) != 0xdc00) {
        to_unicode(&local_50,codepoint1,0);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_50);
        puVar4 = puVar3 + 6;
        goto switchD_0010da22_caseD_6f;
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"missing high surrogate");
    }
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  default:
    if ((((uVar1 != '\"') && (uVar1 != '/')) && (uVar1 != '\\')) &&
       ((uVar1 != 'b' && (uVar1 != 'f')))) goto switchD_0010da22_caseD_6f;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  goto switchD_0010da22_caseD_6f;
}

Assistant:

string_t get_string() const
        {
            assert(m_cursor - m_start >= 2);

            string_t result;
            result.reserve(static_cast<size_t>(m_cursor - m_start - 2));

            // iterate the result between the quotes
            for (const lexer_char_t* i = m_start + 1; i < m_cursor - 1; ++i)
            {
                // find next escape character
                auto e = std::find(i, m_cursor - 1, '\\');
                if (e != i)
                {
                    // see https://github.com/nlohmann/json/issues/365#issuecomment-262874705
                    for (auto k = i; k < e; k++)
                    {
                        result.push_back(static_cast<typename string_t::value_type>(*k));
                    }
                    i = e - 1; // -1 because of ++i
                }
                else
                {
                    // processing escaped character
                    // read next character
                    ++i;

                    switch (*i)
                    {
                        // the default escapes
                        case 't':
                        {
                            result += "\t";
                            break;
                        }
                        case 'b':
                        {
                            result += "\b";
                            break;
                        }
                        case 'f':
                        {
                            result += "\f";
                            break;
                        }
                        case 'n':
                        {
                            result += "\n";
                            break;
                        }
                        case 'r':
                        {
                            result += "\r";
                            break;
                        }
                        case '\\':
                        {
                            result += "\\";
                            break;
                        }
                        case '/':
                        {
                            result += "/";
                            break;
                        }
                        case '"':
                        {
                            result += "\"";
                            break;
                        }

                        // unicode
                        case 'u':
                        {
                            // get code xxxx from uxxxx
                            auto codepoint = std::strtoul(std::string(reinterpret_cast<typename string_t::const_pointer>(i + 1),
                                                          4).c_str(), nullptr, 16);

                            // check if codepoint is a high surrogate
                            if (codepoint >= 0xD800 and codepoint <= 0xDBFF)
                            {
                                // make sure there is a subsequent unicode
                                if ((i + 6 >= m_limit) or * (i + 5) != '\\' or * (i + 6) != 'u')
                                {
                                    JSON_THROW(std::invalid_argument("missing low surrogate"));
                                }

                                // get code yyyy from uxxxx\uyyyy
                                auto codepoint2 = std::strtoul(std::string(reinterpret_cast<typename string_t::const_pointer>
                                                               (i + 7), 4).c_str(), nullptr, 16);
                                result += to_unicode(codepoint, codepoint2);
                                // skip the next 10 characters (xxxx\uyyyy)
                                i += 10;
                            }
                            else if (codepoint >= 0xDC00 and codepoint <= 0xDFFF)
                            {
                                // we found a lone low surrogate
                                JSON_THROW(std::invalid_argument("missing high surrogate"));
                            }
                            else
                            {
                                // add unicode character(s)
                                result += to_unicode(codepoint);
                                // skip the next four characters (xxxx)
                                i += 4;
                            }
                            break;
                        }
                    }
                }
            }

            return result;
        }